

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF(VmaBlockMetadata_TLSF *this)

{
  Block **__ptr;
  VkAllocationCallbacks *pVVar1;
  
  (this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata =
       (_func_int **)&PTR__VmaBlockMetadata_TLSF_00330000;
  __ptr = this->m_FreeList;
  if (__ptr != (Block **)0x0) {
    pVVar1 = (this->super_VmaBlockMetadata).m_pAllocationCallbacks;
    if ((pVVar1 == (VkAllocationCallbacks *)0x0) || (pVVar1->pfnFree == (PFN_vkFreeFunction)0x0)) {
      free(__ptr);
    }
    else {
      (*pVVar1->pfnFree)(pVVar1->pUserData,__ptr);
    }
  }
  VmaBlockBufferImageGranularity::Destroy
            (&this->m_GranularityHandler,(this->super_VmaBlockMetadata).m_pAllocationCallbacks);
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::~VmaPoolAllocator(&this->m_BlockAllocator);
  return;
}

Assistant:

VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF()
{
    if (m_FreeList)
        vma_delete_array(GetAllocationCallbacks(), m_FreeList, m_ListsCount);
    m_GranularityHandler.Destroy(GetAllocationCallbacks());
}